

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O1

Node * __thiscall ScapeGoatTree::findMin(ScapeGoatTree *this,Node *node)

{
  Node *pNVar1;
  
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar1 = node;
    node = node->leftChild;
  } while (node != (Node *)0x0);
  return pNVar1;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::findMin(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->leftChild == nullptr) {
        return node;
    } else {
        return findMin(node->leftChild);
    }
}